

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestSessionExecutor.cpp
# Opt level: O2

void __thiscall
tcu::TestSessionExecutor::TestSessionExecutor
          (TestSessionExecutor *this,TestPackageRoot *root,TestContext *testCtx)

{
  this->m_testCtx = testCtx;
  DefaultHierarchyInflater::DefaultHierarchyInflater(&this->m_inflater,testCtx);
  CommandLine::createCaseListFilter
            (&this->m_caseListFilter,testCtx->m_cmdLine,testCtx->m_curArchive);
  TestHierarchyIterator::TestHierarchyIterator
            (&this->m_iterator,root,&(this->m_inflater).super_TestHierarchyInflater,
             (this->m_caseListFilter).
             super_UniqueBase<tcu::CaseListFilter,_de::DefaultDeleter<tcu::CaseListFilter>_>.m_data.
             ptr);
  (this->m_caseExecutor).
  super_UniqueBase<tcu::TestCaseExecutor,_de::DefaultDeleter<tcu::TestCaseExecutor>_>.m_data.ptr =
       (TestCaseExecutor *)0x0;
  (this->m_status).numExecuted = 0;
  (this->m_status).numPassed = 0;
  (this->m_status).numFailed = 0;
  (this->m_status).numNotSupported = 0;
  *(undefined8 *)((long)&(this->m_status).numNotSupported + 1) = 0;
  this->m_state = STATE_TRAVERSE_HIERARCHY;
  this->m_abortSession = false;
  this->m_isInTestCase = false;
  this->m_testStartTime = 0;
  return;
}

Assistant:

TestSessionExecutor::TestSessionExecutor (TestPackageRoot& root, TestContext& testCtx)
	: m_testCtx			(testCtx)
	, m_inflater		(testCtx)
	, m_caseListFilter	(testCtx.getCommandLine().createCaseListFilter(testCtx.getArchive()))
	, m_iterator		(root, m_inflater, *m_caseListFilter)
	, m_state			(STATE_TRAVERSE_HIERARCHY)
	, m_abortSession	(false)
	, m_isInTestCase	(false)
	, m_testStartTime	(0)
{
}